

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadThreadsGraph.cc
# Opt level: O3

bool __thiscall
ReadThreadsGraph::add_thread
          (ReadThreadsGraph *this,int64_t thread_id,
          vector<NodePosition,_std::allocator<NodePosition>_> *node_positions,bool remove_duplicated
          ,int min_thread_nodes)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  long lVar3;
  mapped_type *pmVar4;
  _Hash_node_base *p_Var5;
  bool bVar6;
  uint16_t uVar7;
  int iVar8;
  ulong uVar9;
  const_iterator __end2;
  pointer pNVar10;
  vector<NodePosition,_std::allocator<NodePosition>_> *__range2;
  const_iterator __begin2;
  pointer pNVar11;
  Support support;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> duplicated;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> seen;
  _Hash_node_base *local_d0;
  ReadThreadsGraph *local_c8;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_c0;
  sgNodeID_t local_b8;
  int64_t local_b0;
  int64_t local_a8;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  pNVar11 = (node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pNVar10 = (node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  local_c8 = this;
  local_b0 = thread_id;
  local_a8 = thread_id;
  if ((ulong)(long)min_thread_nodes <= (ulong)((long)pNVar10 - (long)pNVar11 >> 4)) {
    if (remove_duplicated) {
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_a0._M_element_count = 0;
      if (pNVar11 != pNVar10) {
        do {
          p_Var1 = (_Hash_node_base *)pNVar11->node;
          local_d0 = (_Hash_node_base *)-(long)p_Var1;
          if (0 < (long)p_Var1) {
            local_d0 = p_Var1;
          }
          if (local_68._M_buckets[(ulong)local_d0 % local_68._M_bucket_count] !=
              (__node_base_ptr)0x0) {
            p_Var1 = local_68._M_buckets[(ulong)local_d0 % local_68._M_bucket_count]->_M_nxt;
            p_Var5 = p_Var1[1]._M_nxt;
            do {
              if (local_d0 == p_Var5) {
                local_c0 = &local_a0;
                std::
                _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long,false>>>>
                          ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)local_c0,&local_d0,&local_c0);
                goto LAB_00201c9d;
              }
              p_Var1 = p_Var1->_M_nxt;
            } while ((p_Var1 != (_Hash_node_base *)0x0) &&
                    (p_Var5 = p_Var1[1]._M_nxt,
                    (ulong)p_Var5 % local_68._M_bucket_count ==
                    (ulong)local_d0 % local_68._M_bucket_count));
          }
          local_c0 = &local_68;
          std::
          _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long,false>>>>
                    ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_68,&local_d0,&local_c0);
LAB_00201c9d:
          pNVar11 = pNVar11 + 1;
        } while (pNVar11 != pNVar10);
        pNVar11 = (node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pNVar10 = (node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    if (pNVar10 != pNVar11) {
      iVar8 = -1;
      uVar9 = 0;
      uVar7 = 0;
      do {
        if (remove_duplicated) {
          p_Var1 = (_Hash_node_base *)pNVar11[uVar9].node;
          p_Var5 = (_Hash_node_base *)-(long)p_Var1;
          if (0 < (long)p_Var1) {
            p_Var5 = p_Var1;
          }
          if (local_a0._M_buckets[(ulong)p_Var5 % local_a0._M_bucket_count] != (__node_base_ptr)0x0)
          {
            p_Var1 = local_a0._M_buckets[(ulong)p_Var5 % local_a0._M_bucket_count]->_M_nxt;
            p_Var2 = p_Var1[1]._M_nxt;
            do {
              if (p_Var5 == p_Var2) goto LAB_00201d8d;
              p_Var1 = p_Var1->_M_nxt;
            } while ((p_Var1 != (_Hash_node_base *)0x0) &&
                    (p_Var2 = p_Var1[1]._M_nxt,
                    (ulong)p_Var2 % local_a0._M_bucket_count ==
                    (ulong)p_Var5 % local_a0._M_bucket_count));
          }
        }
        if (iVar8 == -1) {
          local_b8 = pNVar11[uVar9].node;
        }
        else {
          support._0_8_ = (ulong)uVar7 << 0x10 | 7;
          support.id = local_b0;
          DistanceGraph::add_link
                    (&local_c8->super_DistanceGraph,-pNVar11[iVar8].node,pNVar11[uVar9].node,
                     pNVar11[uVar9].start - pNVar11[iVar8].end,support);
          uVar7 = uVar7 + 1;
          pNVar11 = (node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pNVar10 = (node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        }
        iVar8 = (int)uVar9;
LAB_00201d8d:
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)pNVar10 - (long)pNVar11 >> 4));
      if (iVar8 != -1) {
        lVar3 = pNVar11[iVar8].node;
        pmVar4 = std::__detail::
                 _Map_base<long,_std::pair<const_long,_ThreadInfo>,_std::allocator<std::pair<const_long,_ThreadInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<long,_std::pair<const_long,_ThreadInfo>,_std::allocator<std::pair<const_long,_ThreadInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_c8->thread_info,&local_a8);
        pmVar4->start = local_b8;
        pmVar4->end = -lVar3;
        pmVar4->link_count = uVar7;
        bVar6 = true;
        goto LAB_00201de0;
      }
    }
  }
  bVar6 = false;
LAB_00201de0:
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return bVar6;
}

Assistant:

bool ReadThreadsGraph::add_thread(int64_t thread_id, const std::vector<NodePosition> &node_positions, bool remove_duplicated, int min_thread_nodes) {
    std::unordered_set<sgNodeID_t> seen,duplicated;
    if (node_positions.size()<min_thread_nodes) return false;
    if (remove_duplicated) {
        seen.clear();
        duplicated.clear();
        for (const auto &p:node_positions){
            if (seen.count(llabs(p.node))) duplicated.insert(llabs(p.node));
            else seen.insert(llabs(p.node));
        }
    }
    uint16_t lidx=0;
    int32_t last_valid_i=-1;
    sgNodeID_t end1;
    for (int32_t i = 0; i < node_positions.size(); ++i) {
        if (remove_duplicated and  duplicated.count(llabs(node_positions[i].node))) continue;
        if (last_valid_i!=-1) {
            add_link(-node_positions[last_valid_i].node, node_positions[i].node,
                     node_positions[i].start - node_positions[last_valid_i].end,
                     {SupportType::LongRead, lidx++, thread_id});
        }
        else end1=node_positions[i].node;
        last_valid_i=i;
    }
    if (last_valid_i==-1) return false;
    sgNodeID_t end2=-node_positions[last_valid_i].node;
    thread_info[thread_id]={end1, end2, lidx};
    return true;
}